

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O3

void __thiscall
ExecutorTest_PrintWorks_Test::~ExecutorTest_PrintWorks_Test(ExecutorTest_PrintWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, PrintWorks)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    print("test!");
    ret 0;
  }
  )SRC";

  std::string expected = "test!\n";

  testProgram(source, expected, 0);
}